

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlAddEncodingAlias(char *name,char *alias)

{
  __int32_t _Var1;
  __int32_t *p_Var2;
  int iVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  xmlCharEncodingAliasPtr pxVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  char upper [100];
  char local_98 [104];
  
  iVar9 = -1;
  if (alias != (char *)0x0 && name != (char *)0x0) {
    pp_Var4 = __ctype_toupper_loc();
    p_Var2 = *pp_Var4;
    uVar5 = 0;
    do {
      _Var1 = p_Var2[(byte)alias[uVar5]];
      local_98[uVar5] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_0012c468;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 99);
    uVar5 = 99;
LAB_0012c468:
    local_98[uVar5 & 0xffffffff] = '\0';
    pxVar6 = xmlCharEncodingAliases;
    uVar11 = xmlCharEncodingAliasesMax;
    if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
      if (xmlCharEncodingAliasesMax < 1) {
        uVar11 = 0x14;
      }
      else {
        if (999999999 < (uint)xmlCharEncodingAliasesMax) {
          return -1;
        }
        uVar10 = xmlCharEncodingAliasesMax + 1U >> 1;
        uVar11 = uVar10 + xmlCharEncodingAliasesMax;
        if (1000000000 - uVar10 < (uint)xmlCharEncodingAliasesMax) {
          uVar11 = 1000000000;
        }
      }
      pxVar6 = (xmlCharEncodingAliasPtr)(*xmlRealloc)(xmlCharEncodingAliases,(ulong)uVar11 << 4);
      if (pxVar6 == (xmlCharEncodingAliasPtr)0x0) {
        return -1;
      }
    }
    xmlCharEncodingAliasesMax = uVar11;
    xmlCharEncodingAliases = pxVar6;
    pxVar6 = xmlCharEncodingAliases;
    uVar5 = (ulong)(uint)xmlCharEncodingAliasesNb;
    if (0 < xmlCharEncodingAliasesNb) {
      lVar12 = 0;
      do {
        iVar3 = strcmp(*(char **)((long)&pxVar6->alias + lVar12),local_98);
        if (iVar3 == 0) {
          pcVar7 = (*xmlMemStrdup)(name);
          if (pcVar7 == (char *)0x0) {
            return -1;
          }
          (*xmlFree)(*(void **)((long)&xmlCharEncodingAliases->name + lVar12));
          *(char **)((long)&xmlCharEncodingAliases->name + lVar12) = pcVar7;
          goto LAB_0012c588;
        }
        lVar12 = lVar12 + 0x10;
      } while (uVar5 << 4 != lVar12);
    }
    pcVar7 = (*xmlMemStrdup)(name);
    if (pcVar7 != (char *)0x0) {
      pcVar8 = (*xmlMemStrdup)(local_98);
      pxVar6 = xmlCharEncodingAliases;
      if (pcVar8 == (char *)0x0) {
        (*xmlFree)(pcVar7);
      }
      else {
        lVar12 = (long)xmlCharEncodingAliasesNb;
        xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
        xmlCharEncodingAliases[lVar12].name = pcVar7;
        pxVar6[lVar12].alias = pcVar8;
LAB_0012c588:
        iVar9 = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];
    char *nameCopy, *aliasCopy;

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = (char) toupper((unsigned char) alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
        xmlCharEncodingAliasPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(xmlCharEncodingAliasesMax, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(xmlCharEncodingAliases, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        xmlCharEncodingAliases = tmp;
        xmlCharEncodingAliasesMax = newSize;
    }

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    nameCopy = xmlMemStrdup(name);
            if (nameCopy == NULL)
                return(-1);
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = nameCopy;
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    nameCopy = xmlMemStrdup(name);
    if (nameCopy == NULL)
        return(-1);
    aliasCopy = xmlMemStrdup(upper);
    if (aliasCopy == NULL) {
        xmlFree(nameCopy);
        return(-1);
    }
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = nameCopy;
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = aliasCopy;
    xmlCharEncodingAliasesNb++;
    return(0);
}